

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O3

bool __thiscall TGAImage::read_tga_file(TGAImage *this,string *filename)

{
  pointer puVar1;
  pointer puVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  ostream *poVar8;
  ifstream in;
  allocator_type local_25a;
  value_type_conflict2 local_259;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined2 local_248;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_238;
  long local_220 [4];
  int aiStack_200 [122];
  
  std::ifstream::ifstream((string *)local_220);
  std::ifstream::open((string *)local_220,(_Ios_Openmode)filename);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"can\'t open file ",0x10);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::ifstream::close();
  }
  else {
    local_258 = 0;
    uStack_250 = 0;
    local_248 = 0;
    std::istream::read((char *)local_220,(long)&local_258);
    if (*(int *)((long)aiStack_200 + *(long *)(local_220[0] + -0x18)) == 0) {
      this->width = (uint)uStack_250._4_2_;
      this->height = (uint)uStack_250._6_2_;
      uVar5 = (uint)((byte)local_248 >> 3);
      this->bytespp = uVar5;
      if (((uStack_250._6_2_ != 0 && uStack_250._4_2_ != 0) && ((byte)local_248 >> 3 < 5)) &&
         ((0x1aU >> uVar5 & 1) != 0)) {
        local_259 = '\0';
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_238,(ulong)((uint)uStack_250._6_2_ * (uint)uStack_250._4_2_ * uVar5),
                   &local_259,&local_25a);
        puVar1 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar2 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (puVar1 != (pointer)0x0) {
          operator_delete(puVar1,(long)puVar2 - (long)puVar1);
          if (local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_238.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_238.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_238.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        if ((local_258._2_1_ & 0xfe) == 10) {
          bVar4 = load_rle_data(this,(ifstream *)local_220);
          if (bVar4) {
LAB_00103d19:
            if ((local_248 & 0x2000) == 0) {
              flip_vertically(this);
            }
            if ((local_248._1_1_ & 0x10) != 0) {
              flip_horizontally(this);
            }
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"x",1);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"/",1);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            bVar4 = true;
            std::ifstream::close();
            goto LAB_00103c16;
          }
LAB_00103ce6:
          std::ifstream::close();
          lVar6 = 0x29;
          pcVar7 = "an error occurred while reading the data\n";
          poVar8 = (ostream *)&std::cerr;
        }
        else {
          if ((local_258._2_1_ & 0xfe) == 2) {
            std::istream::read((char *)local_220,
                               (long)(this->data).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
            if (*(int *)((long)aiStack_200 + *(long *)(local_220[0] + -0x18)) == 0)
            goto LAB_00103d19;
            goto LAB_00103ce6;
          }
          std::ifstream::close();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"unknown file format ",0x14);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          lVar6 = 1;
          pcVar7 = "\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,lVar6);
        goto LAB_00103c14;
      }
      std::ifstream::close();
      lVar6 = 0x20;
      pcVar7 = "bad bpp (or width/height) value\n";
    }
    else {
      std::ifstream::close();
      lVar6 = 0x2b;
      pcVar7 = "an error occurred while reading the header\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar6);
  }
LAB_00103c14:
  bVar4 = false;
LAB_00103c16:
  std::ifstream::~ifstream(local_220);
  return bVar4;
}

Assistant:

bool TGAImage::read_tga_file(const std::string filename)
{
    std::ifstream in;
    in.open(filename, std::ios::binary);
    if (!in.is_open()) {
        std::cerr << "can't open file " << filename << "\n";
        in.close();
        return false;
    }
    TGA_Header header{};
    in.read(reinterpret_cast<char *>(&header), sizeof(header));
    if (!in.good()) {
        in.close();
        std::cerr << "an error occurred while reading the header\n";
        return false;
    }
    width = header.width;
    height = header.height;
    bytespp = header.bitsperpixel >> 3;
    if (width <= 0 || height <= 0 || (bytespp != GRAYSCALE && bytespp != RGB && bytespp != RGBA)) {
        in.close();
        std::cerr << "bad bpp (or width/height) value\n";
        return false;
    }
    size_t nbytes = bytespp * width * height;
    data = std::vector<std::uint8_t>(nbytes, 0);
    if (3 == header.datatypecode || 2 == header.datatypecode) {
        in.read(reinterpret_cast<char *>(data.data()), nbytes);
        if (!in.good()) {
            in.close();
            std::cerr << "an error occurred while reading the data\n";
            return false;
        }
    } else if (10 == header.datatypecode || 11 == header.datatypecode) {
        if (!load_rle_data(in)) {
            in.close();
            std::cerr << "an error occurred while reading the data\n";
            return false;
        }
    } else {
        in.close();
        std::cerr << "unknown file format " << (size_t)header.datatypecode << "\n";
        return false;
    }
    if (!(header.imagedescriptor & 0x20)) flip_vertically();
    if (header.imagedescriptor & 0x10) flip_horizontally();
    std::cerr << width << "x" << height << "/" << bytespp * 8 << "\n";
    in.close();
    return true;
}